

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rock_sample.cpp
# Opt level: O0

void __thiscall
despot::RockSample::PrintObs(RockSample *this,State *state,OBS_TYPE observation,ostream *out)

{
  ostream *poVar1;
  ostream *out_local;
  OBS_TYPE observation_local;
  State *state_local;
  RockSample *this_local;
  
  if (observation == 0) {
    poVar1 = std::operator<<(out,"Bad");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (observation == 1) {
    poVar1 = std::operator<<(out,"Good");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (observation == 2) {
    poVar1 = std::operator<<(out,"None");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void RockSample::PrintObs(const State& state, OBS_TYPE observation,
	ostream& out) const {
	switch (observation) {
	case E_NONE:
		out << "None" << endl;
		break;
	case E_GOOD:
		out << "Good" << endl;
		break;
	case E_BAD:
		out << "Bad" << endl;
		break;
	}
}